

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

TestCaseGroup * vkt::pipeline::createMultisampleSampledImageTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  TestContext *local_10;
  TestContext *testCtx_local;
  
  local_10 = testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"sampled_image",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Multisampled image direct sample access",&local_69);
  pTVar1 = createTestGroup(testCtx,&local_30,&local_68,
                           anon_unknown_0::createSampledImageTestsInGroup);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createMultisampleSampledImageTests (tcu::TestContext& testCtx)
{
	return createTestGroup(testCtx, "sampled_image", "Multisampled image direct sample access", createSampledImageTestsInGroup);
}